

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

void Process::Private::splitCommandLine(String *commandLine,List<String> *command)

{
  usize uVar1;
  usize *puVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  String arg;
  String local_50;
  
  local_50.data = &String::emptyData.super_Data;
  pcVar5 = String::operator_cast_to_char_(commandLine);
LAB_00104c4a:
  do {
    cVar3 = *pcVar5;
    if (cVar3 != ' ') {
      if (cVar3 == '\"') {
        pcVar5 = pcVar5 + 1;
LAB_00104ca5:
        do {
          cVar3 = *pcVar5;
          do {
            if (cVar3 != '\\') {
              if (cVar3 == '\0') goto LAB_00104c4a;
              if (cVar3 == '\"') goto LAB_00104d5b;
              uVar1 = (local_50.data)->len + 1;
              String::detach(&local_50,(local_50.data)->len,uVar1);
              pcVar5 = pcVar5 + 1;
              ((Data *)&(local_50.data)->str)->str[(local_50.data)->len] = cVar3;
              pcVar4 = ((Data *)&(local_50.data)->str)->str;
              (local_50.data)->len = uVar1;
              pcVar4[uVar1] = '\0';
              goto LAB_00104ca5;
            }
          } while (pcVar5[1] != '\"');
          uVar1 = (local_50.data)->len + 1;
          String::detach(&local_50,(local_50.data)->len,uVar1);
          ((Data *)&(local_50.data)->str)->str[(local_50.data)->len] = '\"';
          pcVar4 = ((Data *)&(local_50.data)->str)->str;
          (local_50.data)->len = uVar1;
          pcVar4[uVar1] = '\0';
          pcVar5 = pcVar5 + 2;
        } while( true );
      }
      if (cVar3 == '\0') {
        if ((local_50.data)->len != 0) {
          List<String>::insert(command,&command->_end,&local_50);
        }
        if ((local_50.data)->ref != 0) {
          LOCK();
          puVar2 = &(local_50.data)->ref;
          *puVar2 = *puVar2 - 1;
          UNLOCK();
          if ((*puVar2 == 0) && (local_50.data != (Data *)0x0)) {
            operator_delete__(local_50.data);
          }
        }
        return;
      }
      uVar1 = (local_50.data)->len + 1;
      String::detach(&local_50,(local_50.data)->len,uVar1);
      pcVar5 = pcVar5 + 1;
      ((Data *)&(local_50.data)->str)->str[(local_50.data)->len] = cVar3;
      pcVar4 = ((Data *)&(local_50.data)->str)->str;
      (local_50.data)->len = uVar1;
      pcVar4[uVar1] = '\0';
      goto LAB_00104c4a;
    }
    List<String>::insert(command,&command->_end,&local_50);
    String::clear(&local_50);
LAB_00104d5b:
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

static void splitCommandLine(const String& commandLine, List<String>& command)
  {
    String arg;
    for (const char* p = commandLine; *p;)
      switch (*p)
      {
      case '"':
        for (++p; *p;)
        {
          switch (*p)
          {
          case '"':
            ++p;
            break;
          case '\\':
            if (p[1] == '"')
            {
              arg.append('"');
              p += 2;
            }
            continue;
          default:
            arg.append(*(p++));
            continue;
          }
          break;
        }
        break;
      case ' ':
        command.append(arg);
        arg.clear();
        ++p;
        break;
      default:
        arg.append(*(p++));
      }
    if (!arg.isEmpty())
      command.append(arg);
  }